

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadZstdDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_cwksp *ws,
                 ZSTD_CCtx_params *params,void *dict,size_t dictSize,ZSTD_dictTableLoadMethod_e dtlm
                 ,void *workspace)

{
  uint uVar1;
  void *src;
  ZSTD_compressedBlockState_t *code;
  uint local_7c;
  size_t err_code_1;
  size_t dictContentSize;
  size_t err_code;
  size_t eSize;
  size_t dictID;
  BYTE *dictEnd;
  BYTE *dictPtr;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_cwksp *ws_local;
  ZSTD_matchState_t *ms_local;
  ZSTD_compressedBlockState_t *bs_local;
  
  if ((params->fParams).noDictIDFlag == 0) {
    local_7c = MEM_readLE32((void *)((long)dict + 4));
  }
  else {
    local_7c = 0;
  }
  bs_local = (ZSTD_compressedBlockState_t *)ZSTD_loadCEntropy(bs,workspace,dict,dictSize);
  uVar1 = ERR_isError((size_t)bs_local);
  if (uVar1 == 0) {
    src = (void *)((long)&(bs_local->entropy).huf.CTable[0].val + (long)dict);
    code = (ZSTD_compressedBlockState_t *)
           ZSTD_loadDictionaryContent
                     (ms,(ldmState_t *)0x0,ws,params,src,(long)dict + (dictSize - (long)src),dtlm);
    uVar1 = ERR_isError((size_t)code);
    bs_local = (ZSTD_compressedBlockState_t *)(ulong)local_7c;
    if (uVar1 != 0) {
      bs_local = code;
    }
  }
  return (size_t)bs_local;
}

Assistant:

static size_t ZSTD_loadZstdDictionary(ZSTD_compressedBlockState_t* bs,
                                      ZSTD_matchState_t* ms,
                                      ZSTD_cwksp* ws,
                                      ZSTD_CCtx_params const* params,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictTableLoadMethod_e dtlm,
                                      void* workspace)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;
    size_t dictID;
    size_t eSize;
    ZSTD_STATIC_ASSERT(HUF_WORKSPACE_SIZE >= (1<<MAX(MLFSELog,LLFSELog)));
    assert(dictSize >= 8);
    assert(MEM_readLE32(dictPtr) == ZSTD_MAGIC_DICTIONARY);

    dictID = params->fParams.noDictIDFlag ? 0 :  MEM_readLE32(dictPtr + 4 /* skip magic number */ );
    eSize = ZSTD_loadCEntropy(bs, workspace, dict, dictSize);
    FORWARD_IF_ERROR(eSize, "ZSTD_loadCEntropy failed");
    dictPtr += eSize;

    {
        size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        FORWARD_IF_ERROR(ZSTD_loadDictionaryContent(
            ms, NULL, ws, params, dictPtr, dictContentSize, dtlm), "");
    }
    return dictID;
}